

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool ON_IsOrthogonalFrame(ON_3dVector *X,ON_3dVector *Y,ON_3dVector *Z)

{
  undefined1 auVar1 [16];
  bool bVar2;
  undefined4 in_ECX;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  ON_3dVector local_50;
  ON_3dVector local_38;
  
  bVar2 = ON_3dVector::IsValid(X);
  if (((bVar2) && (bVar2 = ON_3dVector::IsValid(Y), bVar2)) &&
     (bVar2 = ON_3dVector::IsValid(Z), bVar2)) {
    dVar4 = ON_3dVector::Length(X);
    dVar5 = ON_3dVector::Length(Y);
    dVar6 = ON_3dVector::Length(Z);
    if (dVar4 <= 1.490116119385e-08) {
      return false;
    }
    if (dVar5 <= 1.490116119385e-08) {
      return false;
    }
    if (dVar6 <= 1.490116119385e-08) {
      return false;
    }
    auVar10._8_4_ = SUB84(dVar6,0);
    auVar10._0_8_ = dVar4;
    auVar10._12_4_ = (int)((ulong)dVar6 >> 0x20);
    auVar10 = divpd(_DAT_006909c0,auVar10);
    dVar5 = 1.0 / dVar5;
    dVar9 = auVar10._0_8_;
    dVar7 = ABS((X->z * Y->z + X->x * Y->x + X->y * Y->y) * dVar9 * dVar5);
    dVar8 = auVar10._8_8_;
    dVar4 = ABS(dVar8 * (Z->z * X->z + Z->x * X->x + Z->y * X->y) * dVar9);
    dVar6 = ABS(dVar5 * (Z->z * Y->z + Z->x * Y->x + Z->y * Y->y) * dVar8);
    if (((dVar7 <= 1.490116119385e-08) && (dVar6 <= 1.490116119385e-08)) &&
       (dVar4 <= 1.490116119385e-08)) {
      return true;
    }
    if (1.52587890625e-05 <= dVar7) {
      return false;
    }
    auVar1._8_8_ = -(ulong)(dVar6 < 1.52587890625e-05);
    auVar1._0_8_ = -(ulong)(dVar4 < 1.52587890625e-05);
    uVar3 = movmskpd(in_ECX,auVar1);
    if ((byte)((byte)uVar3 >> 1) == 0) {
      return false;
    }
    if ((uVar3 & 1) == 0) {
      return false;
    }
    dVar4 = dVar9 * dVar5;
    ON_CrossProduct(&local_50,X,Y);
    ON_3dVector::ON_3dVector(&local_38,local_50.x * dVar4,local_50.y * dVar4,dVar4 * local_50.z);
    if (ABS(ABS((local_38.z * Z->z + local_38.x * Z->x + local_38.y * Z->y) * dVar8) + -1.0) <=
        1.490116119385e-08) {
      dVar4 = dVar5 * dVar8;
      ON_CrossProduct(&local_50,Y,Z);
      ON_3dVector::ON_3dVector(&local_38,local_50.x * dVar4,local_50.y * dVar4,dVar4 * local_50.z);
      if (ABS(ABS((local_38.z * X->z + local_38.x * X->x + local_38.y * X->y) * dVar9) + -1.0) <=
          1.490116119385e-08) {
        dVar8 = dVar8 * dVar9;
        ON_CrossProduct(&local_50,Z,X);
        ON_3dVector::ON_3dVector(&local_38,local_50.x * dVar8,local_50.y * dVar8,dVar8 * local_50.z)
        ;
        if (ABS(ABS(dVar5 * (local_38.z * Y->z + local_38.x * Y->x + local_38.y * Y->y)) + -1.0) <=
            1.490116119385e-08) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_IsOrthogonalFrame( const ON_3dVector& X,  const ON_3dVector& Y,  const ON_3dVector& Z )
{
  // returns true if X, Y, Z is an orthogonal frame
  if (! X.IsValid() || !Y.IsValid() || !Z.IsValid() )
    return false;

  double lx = X.Length();
  double ly = Y.Length();
  double lz = Z.Length();
  if ( lx <=  ON_SQRT_EPSILON )
    return false;
  if ( ly <=  ON_SQRT_EPSILON )
    return false;
  if ( lz <=  ON_SQRT_EPSILON )
    return false;
  lx = 1.0/lx;
  ly = 1.0/ly;
  lz = 1.0/lz;
  double xy = (X.x*Y.x + X.y*Y.y + X.z*Y.z)*lx*ly;
  double yz = (Y.x*Z.x + Y.y*Z.y + Y.z*Z.z)*ly*lz;
  double zx = (Z.x*X.x + Z.y*X.y + Z.z*X.z)*lz*lx;
  if (    fabs(xy) > ON_SQRT_EPSILON 
       || fabs(yz) > ON_SQRT_EPSILON
       || fabs(zx) > ON_SQRT_EPSILON
     )
  {
    double t = 0.0000152587890625;
    if ( fabs(xy) >= t || fabs(yz)  >= t || fabs(zx) >= t )
      return false;

    // do a more careful (and time consuming check)
    // This fixes RR 22219 and 22276
    ON_3dVector V;
    V = (lx*ly)*ON_CrossProduct(X,Y);
    t = fabs((V.x*Z.x + V.y*Z.y + V.z*Z.z)*lz);
    if ( fabs(t-1.0) > ON_SQRT_EPSILON )
      return false;

    V = (ly*lz)*ON_CrossProduct(Y,Z);
    t = fabs((V.x*X.x + V.y*X.y + V.z*X.z)*lx);
    if ( fabs(t-1.0) > ON_SQRT_EPSILON )
      return false;

    V = (lz*lx)*ON_CrossProduct(Z,X);
    t = fabs((V.x*Y.x + V.y*Y.y + V.z*Y.z)*ly);
    if ( fabs(t-1.0) > ON_SQRT_EPSILON )
      return false;
  }
  return true;
}